

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

XML_Char * poolAppend(STRING_POOL *pool,ENCODING *enc,char *ptr,char *end)

{
  XML_Bool XVar1;
  XML_Convert_Result XVar2;
  char *local_38;
  
  local_38 = ptr;
  if ((pool->ptr != (XML_Char *)0x0) || (XVar1 = poolGrow(pool), XVar1 != '\0')) {
    do {
      XVar2 = (*enc->utf8Convert)(enc,&local_38,end,&pool->ptr,pool->end);
      if (XVar2 < XML_CONVERT_OUTPUT_EXHAUSTED) {
        return pool->start;
      }
      XVar1 = poolGrow(pool);
    } while (XVar1 != '\0');
  }
  return (XML_Char *)0x0;
}

Assistant:

static XML_Char *
poolAppend(STRING_POOL *pool, const ENCODING *enc, const char *ptr,
           const char *end) {
  if (! pool->ptr && ! poolGrow(pool))
    return NULL;
  for (;;) {
    const enum XML_Convert_Result convert_res = XmlConvert(
        enc, &ptr, end, (ICHAR **)&(pool->ptr), (ICHAR *)pool->end);
    if ((convert_res == XML_CONVERT_COMPLETED)
        || (convert_res == XML_CONVERT_INPUT_INCOMPLETE))
      break;
    if (! poolGrow(pool))
      return NULL;
  }
  return pool->start;
}